

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommands
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs,
          cmGeneratorTarget *target,string *relative)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer cc;
  cmCustomCommandGenerator ccg;
  string local_f8;
  cmCustomCommandGenerator local_d8;
  
  cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (cc != pcVar1) {
    do {
      pcVar2 = (this->super_cmLocalCommonGenerator).ConfigName._M_dataplus._M_p;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,pcVar2,
                 pcVar2 + (this->super_cmLocalCommonGenerator).ConfigName._M_string_length);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_d8,cc,&local_f8,(cmLocalGenerator *)this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      AppendCustomCommand(this,commands,&local_d8,target,relative,true,(ostream *)0x0);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_d8);
      cc = cc + 1;
    } while (cc != pcVar1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommands(
  std::vector<std::string>& commands, const std::vector<cmCustomCommand>& ccs,
  cmGeneratorTarget* target, std::string const& relative)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->ConfigName, this);
    this->AppendCustomCommand(commands, ccg, target, relative, true);
  }
}